

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O3

callback_t *
property_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  char *pcVar1;
  QTextStream *this;
  int iVar2;
  code *pcVar3;
  ulong uVar4;
  QByteArrayView QVar5;
  char buffer [80];
  QTextStream *local_98;
  QString local_90;
  char local_78 [88];
  
  while (((iVar2 = std::istream::peek(), iVar2 != 10 &&
          (iVar2 = std::istream::peek(), iVar2 != 0x3d)) &&
         (iVar2 = std::istream::peek(), iVar2 != 0x5b))) {
    std::istream::ignore();
  }
  iVar2 = std::istream::peek();
  if (iVar2 != 10) {
    iVar2 = std::istream::peek();
    if (iVar2 != 0x3d) {
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      return __return_storage_ptr__;
    }
    std::istream::ignore();
    clear_empty(f);
    iVar2 = std::istream::peek();
    if (iVar2 == 0x7b) {
      parser();
      if ((parser()::category[0x10] & 1) != 0) {
        parser();
        local_78[0] = '\x02';
        local_78[1] = '\0';
        local_78[2] = '\0';
        local_78[3] = '\0';
        local_78[4] = '\0';
        local_78[5] = '\0';
        local_78[6] = '\0';
        local_78[7] = '\0';
        local_78[8] = '\0';
        local_78[9] = '\0';
        local_78[10] = '\0';
        local_78[0xb] = '\0';
        local_78[0xc] = '\0';
        local_78[0xd] = '\0';
        local_78[0xe] = '\0';
        local_78[0xf] = '\0';
        local_78[0x10] = '\0';
        local_78[0x11] = '\0';
        local_78[0x12] = '\0';
        local_78[0x13] = '\0';
        local_78[0x14] = '\0';
        local_78[0x15] = '\0';
        local_78[0x16] = '\0';
        local_78[0x17] = '\0';
        local_78[0x18] = parser()::category[8];
        local_78[0x19] = parser()::category[9];
        local_78[0x1a] = parser()::category[10];
        local_78[0x1b] = parser()::category[0xb];
        local_78[0x1c] = parser()::category[0xc];
        local_78[0x1d] = parser()::category[0xd];
        local_78[0x1e] = parser()::category[0xe];
        local_78[0x1f] = parser()::category[0xf];
        QMessageLogger::debug();
        this = local_98;
        QVar5.m_data = (storage_type *)0x1d;
        QVar5.m_size = (qsizetype)&local_90;
        QString::fromUtf8(QVar5);
        QTextStream::operator<<(this,&local_90);
        if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
          }
        }
        if (local_98[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(local_98,' ');
        }
        QDebug::~QDebug((QDebug *)&local_98);
      }
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      pcVar3 = begin_property_set_state;
      goto LAB_0010625b;
    }
    std::istream::getline((char *)f,(long)local_78,'P');
    pcVar1 = *(char **)((anonymous_namespace)::current_property + 0x38);
    uVar4 = (anonymous_namespace)::current_property + 0x30;
    strlen(local_78);
    std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_78);
  }
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  pcVar3 = end_property_state;
LAB_0010625b:
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = pcVar3;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

callback_t property_state(MetaConfiguration &conf, std::ifstream &f,
                          int &error) {
  while (f.peek() != '\n' && f.peek() != '=' && f.peek() != '[') {
    f.ignore();
  }

  // easy, line finished, next property or class.
  if (f.peek() == '\n') {
    return end_property_state;
  } else if (f.peek() == '=') {
    f.ignore();
    clear_empty(f);
    if (f.peek() == '{') {
      qCDebug(parser) << "starting the set property set";
      return begin_property_set_state;
    } else {
      char buffer[80];
      f.getline(buffer, 80, '\n');
      current_property->default_value = buffer;
      return end_property_state;
    }
  }
  return nullptr;
}